

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemtrayicon_x11.cpp
# Opt level: O0

void __thiscall QSystemTrayIconSys::paintEvent(QSystemTrayIconSys *this,QPaintEvent *param_2)

{
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QPainter painter;
  QRect rect;
  int in_stack_ffffffffffffff78;
  AlignmentFlag in_stack_ffffffffffffff7c;
  QPoint *this_00;
  QRect *in_stack_ffffffffffffff90;
  QSize *asize;
  undefined4 in_stack_ffffffffffffff98;
  State SVar1;
  QRect *in_stack_ffffffffffffffa0;
  QPainter *this_01;
  Mode local_3c;
  QPainter local_38 [8];
  undefined1 *local_30;
  QSize local_28;
  QPoint local_20;
  QSize local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = &local_20;
  SVar1 = On;
  QPoint::QPoint(this_00,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
  QWidget::geometry(in_RDI);
  local_28 = QRect::size(in_stack_ffffffffffffff90);
  asize = &local_18;
  QRect::QRect(in_stack_ffffffffffffffa0,(QPoint *)CONCAT44(SVar1,in_stack_ffffffffffffff98),asize);
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)&local_30,&in_RDI->super_QPaintDevice);
  this_01 = local_38;
  QSystemTrayIcon::icon((QSystemTrayIcon *)in_RDI);
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)this_00,in_stack_ffffffffffffff7c);
  QIcon::paint(this_01,(QRect *)&local_30,(QFlags_conflict1 *)asize,local_3c,SVar1);
  QIcon::~QIcon((QIcon *)this_01);
  QPainter::~QPainter((QPainter *)&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSystemTrayIconSys::paintEvent(QPaintEvent *)
{
    const QRect rect(QPoint(0, 0), geometry().size());
    QPainter painter(this);

    q->icon().paint(&painter, rect);
}